

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

void __thiscall trackerboy::Module::Module(Module *this)

{
  Module *this_local;
  
  SongList::SongList(&this->mSongs);
  Table<trackerboy::Instrument>::Table(&this->mInstrumentTable);
  Table<trackerboy::Waveform>::Table(&this->mWaveformTable);
  (this->mVersion).major = 0;
  (this->mVersion).minor = 0;
  (this->mVersion).patch = 0;
  this->mRevisionMajor = 1;
  this->mRevisionMinor = 1;
  memset(&this->mTitle,0,0x20);
  memset(&this->mArtist,0,0x20);
  memset(&this->mCopyright,0,0x20);
  std::__cxx11::string::string((string *)&this->mComments);
  this->mSystem = dmg;
  this->mCustomFramerate = 0x1e;
  return;
}

Assistant:

Module::Module() noexcept :
    mSongs(),
    mInstrumentTable(),
    mWaveformTable(),
    mVersion{0, 0, 0},
    mRevisionMajor(FILE_REVISION_MAJOR),
    mRevisionMinor(FILE_REVISION_MINOR),
    mTitle(),
    mArtist(),
    mCopyright(),
    mComments(),
    mSystem(System::dmg),
    mCustomFramerate(30)
{
}